

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
opengv::getNindices(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int n)

{
  int local_1c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_1c);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>
opengv::getNindices( int n )
{
  std::vector<int> indices;
  for(int i = 0; i < n; i++)
    indices.push_back(i);
  return indices;
}